

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::WindowImplX11(WindowImplX11 *this,WindowHandle handle)

{
  Display *pDVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  WindowImplX11 *in_stack_00000010;
  XSetWindowAttributes attributes;
  WindowImplX11 *in_stack_000000f0;
  undefined1 local_90 [72];
  undefined8 local_48;
  WindowImpl *in_stack_ffffffffffffffd0;
  
  WindowImpl::WindowImpl(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__WindowImplX11_00493bf0;
  in_RDI[0x79] = 0;
  *(undefined4 *)(in_RDI + 0x7b) = 0;
  in_RDI[0x7c] = 0;
  in_RDI[0x7d] = 0;
  *(undefined1 *)(in_RDI + 0x7e) = 1;
  in_RDI[0x7f] = 0;
  in_RDI[0x80] = 0;
  in_RDI[0x81] = 0;
  in_RDI[0x82] = 0;
  *(undefined1 *)(in_RDI + 0x83) = 1;
  Vector2<int>::Vector2((Vector2<int> *)((long)in_RDI + 0x41c),-1,-1);
  *(undefined1 *)((long)in_RDI + 0x424) = 0;
  *(undefined1 *)((long)in_RDI + 0x425) = 0;
  *(undefined1 *)((long)in_RDI + 0x426) = 0;
  *(undefined1 *)((long)in_RDI + 0x427) = 0;
  in_RDI[0x85] = 0;
  in_RDI[0x86] = 0;
  in_RDI[0x87] = 0;
  pDVar1 = OpenDisplay();
  in_RDI[0x7a] = pDVar1;
  anon_unknown.dwarf_26a76a::WindowsImplX11Impl::ewmhSupported();
  *(undefined4 *)(in_RDI + 0x7b) = *(undefined4 *)(in_RDI[0x7a] + 0xe0);
  in_RDI[0x79] = in_RSI;
  if (in_RDI[0x79] != 0) {
    local_48 = 0x63207f;
    XChangeWindowAttributes(in_RDI[0x7a],in_RDI[0x79],0x800,local_90);
    setProtocols(in_stack_000000f0);
    initialize(in_stack_00000010);
  }
  return;
}

Assistant:

WindowImplX11::WindowImplX11(WindowHandle handle) :
m_window         (0),
m_screen         (0),
m_inputMethod    (NULL),
m_inputContext   (NULL),
m_isExternal     (true),
m_oldVideoMode   (0),
m_oldRRCrtc      (0),
m_hiddenCursor   (0),
m_lastCursor     (None),
m_keyRepeat      (true),
m_previousSize   (-1, -1),
m_useSizeHints   (false),
m_fullscreen     (false),
m_cursorGrabbed  (false),
m_windowMapped   (false),
m_iconPixmap     (0),
m_iconMaskPixmap (0),
m_lastInputTime  (0)
{
    using namespace WindowsImplX11Impl;

    // Open a connection with the X server
    m_display = OpenDisplay();

    // Make sure to check for EWMH support before we do anything
    ewmhSupported();

    m_screen = DefaultScreen(m_display);

    // Save the window handle
    m_window = handle;

    if (m_window)
    {
        // Make sure the window is listening to all the required events
        XSetWindowAttributes attributes;
        attributes.event_mask = eventMask;

        XChangeWindowAttributes(m_display, m_window, CWEventMask, &attributes);

        // Set the WM protocols
        setProtocols();

        // Do some common initializations
        initialize();
    }
}